

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O0

unsigned_short sxhash_list(LispPTR obj)

{
  unsigned_short uVar1;
  LispPTR obj_00;
  bool bVar2;
  int local_14;
  ushort local_e;
  int counter;
  unsigned_short hash;
  LispPTR obj_local;
  
  local_e = 0;
  local_14 = 0;
  counter = obj;
  while( true ) {
    bVar2 = false;
    if (local_14 < 0xd) {
      bVar2 = (*(ushort *)((ulong)(MDStypetbl + ((uint)counter >> 9)) ^ 2) & 0x7ff) == 5;
    }
    if (!bVar2) break;
    obj_00 = car(counter);
    uVar1 = sxhash(obj_00);
    local_e = sxhash_rotate(local_e ^ uVar1);
    counter = cdr(counter);
    local_14 = local_14 + 1;
  }
  return local_e;
}

Assistant:

static unsigned short sxhash_list(LispPTR obj) {
  unsigned short hash = 0;
  int counter;
  for (counter = 0; (counter < 13) && (GetTypeNumber(obj) == TYPE_LISTP); counter++) {
    hash = sxhash_rotate(hash ^ sxhash(car(obj)));
    obj = cdr(obj);
  }
  return (hash);
}